

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::UpdateReceiveTime
          (RTPSources *this,uint32_t ssrc,RTPTime *receivetime,RTPAddress *senderaddress)

{
  bool local_39;
  int status;
  bool created;
  RTPInternalSourceData *srcdat;
  RTPAddress *senderaddress_local;
  RTPTime *receivetime_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  srcdat = (RTPInternalSourceData *)senderaddress;
  senderaddress_local = (RTPAddress *)receivetime;
  receivetime_local._4_4_ = ssrc;
  pRStack_18 = this;
  this_local._4_4_ =
       GetRTCPSourceData(this,ssrc,senderaddress,(RTPInternalSourceData **)&status,&local_39);
  if (-1 < this_local._4_4_) {
    if (_status == (RTPInternalSourceData *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      RTPInternalSourceData::UpdateMessageTime(_status,(RTPTime *)senderaddress_local);
      if ((local_39 & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_status);
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::UpdateReceiveTime(uint32_t ssrc,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	// We got valid SSRC info
	srcdat->UpdateMessageTime(receivetime);
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	return 0;
}